

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::Destruct
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this)

{
  Char *Message;
  ulong local_70;
  size_t i;
  iterator pvStack_60;
  int Idx;
  iterator __end3;
  iterator __begin3;
  array<signed_char,_6UL> *__range3;
  IMemoryAllocator *RawAllocator;
  undefined1 local_30 [8];
  string msg;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  if ((this->m_IsDestructed & 1U) != 0) {
    FormatString<char[40]>
              ((string *)local_30,(char (*) [40])"This object has already been destructed");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Destruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x3d0);
    std::__cxx11::string::~string((string *)local_30);
  }
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.Resources = (PipelineResourceDesc *)0x0;
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.ImmutableSamplers = (ImmutableSamplerDesc *)0x0;
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.CombinedSamplerSuffix = (Char *)0x0;
  __range3 = (array<signed_char,_6UL> *)GetRawAllocator();
  if (this->m_StaticVarsMgrs != (ShaderVariableManagerImplType *)0x0) {
    __begin3 = (this->m_StaticResStageIndex)._M_elems;
    __end3 = std::array<signed_char,_6UL>::begin((array<signed_char,_6UL> *)__begin3);
    pvStack_60 = std::array<signed_char,_6UL>::end((array<signed_char,_6UL> *)__begin3);
    for (; __end3 != pvStack_60; __end3 = __end3 + 1) {
      i._4_4_ = (int)*__end3;
      if (-1 < i._4_4_) {
        ShaderVariableManagerVk::Destroy
                  (this->m_StaticVarsMgrs + i._4_4_,(IMemoryAllocator *)__range3);
        ShaderVariableManagerVk::~ShaderVariableManagerVk(this->m_StaticVarsMgrs + i._4_4_);
      }
    }
    this->m_StaticVarsMgrs = (ShaderVariableManagerImplType *)0x0;
  }
  if (this->m_pStaticResCache != (ShaderResourceCacheImplType *)0x0) {
    ShaderResourceCacheVk::~ShaderResourceCacheVk(this->m_pStaticResCache);
    this->m_pStaticResCache = (ShaderResourceCacheImplType *)0x0;
  }
  i._3_1_ = 0xff;
  std::array<signed_char,_6UL>::fill
            (&this->m_StaticResStageIndex,(value_type_conflict3 *)((long)&i + 3));
  this->m_pResourceAttribs = (PipelineResourceAttribsType *)0x0;
  this->m_pImmutableSamplerAttribs = (ImmutableSamplerAttribsType *)0x0;
  if (this->m_pImmutableSamplers != (RefCntAutoPtr<Diligent::SamplerVkImpl> *)0x0) {
    for (local_70 = 0;
        local_70 <
        (this->
        super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
        ).m_Desc.NumImmutableSamplers; local_70 = local_70 + 1) {
      RefCntAutoPtr<Diligent::SamplerVkImpl>::~RefCntAutoPtr(this->m_pImmutableSamplers + local_70);
    }
  }
  std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::reset
            (&this->m_pRawMemory,(pointer)0x0);
  this->m_IsDestructed = true;
  return;
}

Assistant:

void Destruct()
    {
        VERIFY(!m_IsDestructed, "This object has already been destructed");

        this->m_Desc.Resources             = nullptr;
        this->m_Desc.ImmutableSamplers     = nullptr;
        this->m_Desc.CombinedSamplerSuffix = nullptr;

        IMemoryAllocator& RawAllocator = GetRawAllocator();

        if (m_StaticVarsMgrs != nullptr)
        {
            for (int Idx : m_StaticResStageIndex)
            {
                if (Idx >= 0)
                {
                    m_StaticVarsMgrs[Idx].Destroy(RawAllocator);
                    m_StaticVarsMgrs[Idx].~ShaderVariableManagerImplType();
                }
            }
            m_StaticVarsMgrs = nullptr;
        }

        if (m_pStaticResCache != nullptr)
        {
            m_pStaticResCache->~ShaderResourceCacheImplType();
            m_pStaticResCache = nullptr;
        }

        m_StaticResStageIndex.fill(-1);

        static_assert(std::is_trivially_destructible<PipelineResourceAttribsType>::value, "Destructors for m_pResourceAttribs[] are required");
        m_pResourceAttribs = nullptr;
        static_assert(std::is_trivially_destructible<ImmutableSamplerAttribsType>::value, "Destructors for m_pImmutableSamplerAttribs[] are required");
        m_pImmutableSamplerAttribs = nullptr;

        if (m_pImmutableSamplers != nullptr)
        {
            for (size_t i = 0; i < this->m_Desc.NumImmutableSamplers; ++i)
                m_pImmutableSamplers[i].~RefCntAutoPtr<SamplerImplType>();
        }

        m_pRawMemory.reset();

#if DILIGENT_DEBUG
        m_IsDestructed = true;
#endif
    }